

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cc
# Opt level: O2

void cnn::Initialize(int *argc,char ***argv,uint random_seed,bool shared_parameters)

{
  bool bVar1;
  long lVar2;
  ostream *poVar3;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *this;
  AlignedMemoryPool<6U> *pAVar4;
  undefined7 in_register_00000009;
  undefined8 *puVar5;
  uint random_seed_local;
  unsigned_long num_mb;
  int argi;
  undefined4 local_13fc;
  string a2;
  string arg;
  istringstream c;
  
  std::operator<<((ostream *)&std::cerr,"[cnn] using CPU\n");
  kSCALAR_MINUSONE = (undefined4 *)cnn_mm_malloc(4,0x100);
  *kSCALAR_MINUSONE = 0xbf800000;
  kSCALAR_ONE = (undefined4 *)cnn_mm_malloc(4,0x100);
  *kSCALAR_ONE = 0x3f800000;
  kSCALAR_ZERO = (undefined4 *)cnn_mm_malloc(4,0x100);
  puVar5 = &kSCALAR_ZERO;
  *kSCALAR_ZERO = 0;
  argi = 1;
  if (1 < *argc) {
    local_13fc = (undefined4)CONCAT71(in_register_00000009,shared_parameters);
    do {
      std::__cxx11::string::string((string *)&arg,(*argv)[1],(allocator *)&c);
      bVar1 = std::operator==(&arg,"--cnn-mem");
      if ((bVar1) || (bVar1 = std::operator==(&arg,"--cnn_mem"), bVar1)) {
        if (*argc < 2) {
          std::operator<<((ostream *)&std::cerr,
                          "[cnn] --cnn-mem expects an argument (the memory, in megabytes, to reserve)\n"
                         );
          goto LAB_001ea044;
        }
        std::__cxx11::string::string((string *)&a2,(*argv)[2],(allocator *)&c);
        std::__cxx11::istringstream::istringstream((istringstream *)&c,(string *)&a2,_S_in);
        std::istream::_M_extract<unsigned_long>((ulong *)&c);
LAB_001e9de7:
        RemoveArgs(argc,argv,&argi,(int)puVar5);
        std::__cxx11::istringstream::~istringstream((istringstream *)&c);
        std::__cxx11::string::~string((string *)&a2);
        bVar1 = true;
      }
      else {
        bVar1 = std::operator==(&arg,"--cnn-seed");
        if ((bVar1) || (bVar1 = std::operator==(&arg,"--cnn_seed"), bVar1)) {
          if (*argc < 2) {
            std::operator<<((ostream *)&std::cerr,
                            "[cnn] --cnn-seed expects an argument (the random number seed)\n");
            goto LAB_001ea044;
          }
          std::__cxx11::string::string((string *)&a2,(*argv)[2],(allocator *)&c);
          std::__cxx11::istringstream::istringstream((istringstream *)&c,(string *)&a2,_S_in);
          std::istream::_M_extract<unsigned_int>((uint *)&c);
          goto LAB_001e9de7;
        }
        bVar1 = false;
        lVar2 = std::__cxx11::string::find((char *)&arg,0x25d0bd);
        if (lVar2 == 0) {
          poVar3 = std::operator<<((ostream *)&std::cerr,"[cnn] Bad command line argument: ");
          poVar3 = std::operator<<(poVar3,(string *)&arg);
          std::endl<char,std::char_traits<char>>(poVar3);
LAB_001ea044:
          abort();
        }
      }
      std::__cxx11::string::~string((string *)&arg);
    } while ((bVar1) && (1 < *argc));
    shared_parameters = SUB41(local_13fc,0);
  }
  random_seed_local = random_seed;
  if (random_seed == 0) {
    std::random_device::random_device((random_device *)&c);
    random_seed_local = std::random_device::_M_getval();
    std::random_device::~random_device((random_device *)&c);
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"[cnn] random seed: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  this = (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          *)operator_new(5000);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(this,(ulong)random_seed_local);
  rndeng = this;
  poVar3 = std::operator<<((ostream *)&std::cerr,"[cnn] allocating memory: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"MB\n");
  pAVar4 = (AlignedMemoryPool<6U> *)operator_new(0x20);
  AlignedMemoryPool<6U>::AlignedMemoryPool(pAVar4,0x20000000,false);
  fxs = pAVar4;
  pAVar4 = (AlignedMemoryPool<6U> *)operator_new(0x20);
  AlignedMemoryPool<6U>::AlignedMemoryPool(pAVar4,0x20000000,false);
  dEdfs = pAVar4;
  pAVar4 = (AlignedMemoryPool<6U> *)operator_new(0x20);
  AlignedMemoryPool<6U>::AlignedMemoryPool(pAVar4,0x20000000,shared_parameters);
  ps = pAVar4;
  std::operator<<((ostream *)&std::cerr,"[cnn] memory allocation done.\n");
  return;
}

Assistant:

void Initialize(int& argc, char**& argv, unsigned random_seed, bool shared_parameters) {
#if HAVE_CUDA
  cerr << "[cnn] using GPU\n";
  Initialize_GPU(argc, argv);
#else
  cerr << "[cnn] using CPU\n";
  kSCALAR_MINUSONE = (float*) cnn_mm_malloc(sizeof(float), 256);
  *kSCALAR_MINUSONE = -1;
  kSCALAR_ONE = (float*) cnn_mm_malloc(sizeof(float), 256);
  *kSCALAR_ONE = 1;
  kSCALAR_ZERO = (float*) cnn_mm_malloc(sizeof(float), 256);
  *kSCALAR_ZERO = 0;
#endif
  unsigned long num_mb = 512UL;
  int argi = 1;
  while(argi < argc) {
    string arg = argv[argi];
    if (arg == "--cnn-mem" || arg == "--cnn_mem") {
      if ((argi + 1) > argc) {
        cerr << "[cnn] --cnn-mem expects an argument (the memory, in megabytes, to reserve)\n";
        abort();
      } else {
        string a2 = argv[argi+1];
        istringstream c(a2); c >> num_mb;
        RemoveArgs(argc, argv, argi, 2);
      }
    } else if (arg == "--cnn-seed" || arg == "--cnn_seed") {
      if ((argi + 1) > argc) {
        cerr << "[cnn] --cnn-seed expects an argument (the random number seed)\n";
        abort();
      } else {
        string a2 = argv[argi+1];
        istringstream c(a2); c >> random_seed;
        RemoveArgs(argc, argv, argi, 2);
      }
    } else if (arg.find("--cnn") == 0) {
      cerr << "[cnn] Bad command line argument: " << arg << endl;
      abort();
    } else { break; }
  }
  if (random_seed == 0) {
    random_device rd;
    random_seed = rd();
  }
  cerr << "[cnn] random seed: " << random_seed << endl;
  rndeng = new mt19937(random_seed);

  cerr << "[cnn] allocating memory: " << num_mb << "MB\n";
  fxs = new AlignedMemoryPool<ALIGN>(num_mb << 20); // node values
  dEdfs = new AlignedMemoryPool<ALIGN>(num_mb << 20); // node gradients
  ps = new AlignedMemoryPool<ALIGN>(num_mb << 20, shared_parameters); // parameters
  cerr << "[cnn] memory allocation done.\n";
}